

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* str::split(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *__return_storage_ptr__,string_view str,string_view delimiter)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type sVar1;
  size_t __pos;
  bool bVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  size_t local_88;
  size_t local_80;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_t local_58;
  size_t local_50;
  size_type local_48;
  size_t to;
  size_t from;
  undefined1 local_30 [8];
  string_view delimiter_local;
  string_view str_local;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *tokens;
  
  delimiter_local._M_len = (size_t)delimiter._M_str;
  local_30 = (undefined1  [8])delimiter._M_len;
  delimiter_local._M_str = (char *)str._M_len;
  from._7_1_ = 0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&delimiter_local._M_str);
  if (!bVar2) {
    to = 0;
    local_58 = (size_t)local_30;
    local_50 = delimiter_local._M_len;
    bVar4._M_str = (char *)delimiter_local._M_len;
    bVar4._M_len = (size_t)local_30;
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::find
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &delimiter_local._M_str,bVar4,0);
    while (__pos = to, local_48 != 0xffffffffffffffff) {
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&delimiter_local._M_str
                         ,to,local_48 - to);
      local_68 = bVar4;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_68);
      sVar1 = local_48;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      to = sVar1 + sVar3;
      local_88 = (size_t)local_30;
      local_80 = delimiter_local._M_len;
      __str._M_str = (char *)delimiter_local._M_len;
      __str._M_len = (size_t)local_30;
      local_48 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &delimiter_local._M_str,__str,to);
    }
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&delimiter_local._M_str);
    local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &delimiter_local._M_str,__pos,sVar3 - to);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string_view> split(std::string_view str, std::string_view delimiter) {
        std::vector<std::string_view> tokens;

        if (str.empty()) {
            return tokens;
        }

        size_t from = 0;
        size_t to = str.find(delimiter);

        while (to != std::string_view::npos) {
            tokens.push_back(str.substr(from, to - from));
            from = to + delimiter.length();
            to = str.find(delimiter, from);
        }

        tokens.push_back(str.substr(from, str.size() - from));
        return tokens;
    }